

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O0

void JitFFI::OpCode_x64::_movs_ds_base<(unsigned_char)243>
               (JitFuncCreater *jfc,Register dst,Register src)

{
  bool bVar1;
  byte bVar2;
  Register src_local;
  Register dst_local;
  JitFuncCreater *jfc_local;
  
  bVar1 = is_xmmx(dst);
  if ((bVar1) && (bVar1 = is_prx(src), bVar1)) {
    JitFuncCreater::push(jfc,0xf3);
    bVar2 = _get_mov_head(src,dst);
    if (bVar2 != '\0') {
      bVar2 = _get_mov_head_rpxd(src,dst);
      JitFuncCreater::push(jfc,bVar2);
    }
    JitFuncCreater::push(jfc,'\x0f','\x10');
    mov_rx_prx_base(jfc,dst,src);
  }
  else {
    bVar1 = is_prx(dst);
    if ((!bVar1) || (bVar1 = is_xmmx(src), !bVar1)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                    ,0x1be,
                    "void JitFFI::OpCode_x64::_movs_ds_base(JitFuncCreater &, Register, Register) [_Code = (unsigned char)\'\\xf3\']"
                   );
    }
    JitFuncCreater::push(jfc,0xf3);
    bVar2 = _get_mov_head(dst,src);
    if (bVar2 != '\0') {
      bVar2 = _get_mov_head_rpxd(dst,src);
      JitFuncCreater::push(jfc,bVar2);
    }
    JitFuncCreater::push(jfc,'\x0f','\x11');
    mov_prx_rx_base(jfc,dst,src);
  }
  return;
}

Assistant:

inline void _movs_ds_base(JitFuncCreater &jfc, Register dst, Register src) {
			// movs_ XMM, m__
			if (is_xmmx(dst) && is_prx(src)) {
				jfc.push(_Code);
				if (_get_mov_head(src, dst) != 0)
					jfc.push(_get_mov_head_rpxd(src, dst));
				jfc.push(0x0f, 0x10);
				mov_rx_prx_base(jfc, dst, src);
			}
			// movs_ m__, XMM
			else if (is_prx(dst) && is_xmmx(src)) {
				jfc.push(_Code);
				if (_get_mov_head(dst, src) != 0)
					jfc.push(_get_mov_head_rpxd(dst, src));
				jfc.push(0x0f, 0x11);
				mov_prx_rx_base(jfc, dst, src);
			}
			else
				assert(false);
		}